

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

qsizetype QtPrivate::indexOf<QUrl,QUrl>(QList<QUrl> *vector,QUrl *u,qsizetype from)

{
  ulong uVar1;
  long lVar2;
  char cVar3;
  ulong uVar4;
  long lVar5;
  qsizetype qVar6;
  QUrl *pQVar7;
  long lVar8;
  
  uVar1 = (vector->d).size;
  uVar4 = from;
  if (from < 0) {
    uVar4 = from + uVar1;
    if ((long)(from + uVar1) < 1) {
      uVar4 = 0;
    }
  }
  qVar6 = -1;
  if (uVar4 < uVar1) {
    pQVar7 = (vector->d).ptr + uVar4;
    lVar8 = uVar1 * 8 + uVar4 * -8;
    lVar2 = 8 - (long)pQVar7;
    do {
      lVar5 = lVar2;
      if (lVar8 == 0) {
        return -1;
      }
      cVar3 = ::comparesEqual(pQVar7,u);
      pQVar7 = pQVar7 + 1;
      lVar8 = lVar8 + -8;
      lVar2 = lVar5 + -8;
    } while (cVar3 == '\0');
    qVar6 = -((long)&(vector->d).ptr[-1].d + lVar5) >> 3;
  }
  return qVar6;
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}